

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_void>
     ::load(iarchive *ar,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *data,uint protocol_version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value vVar2;
  error *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  optional<unsigned_long> count;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_68;
  optional<unsigned_long> local_40;
  
  vVar2 = (ar->reader).decoder.current.code;
  if (vVar2 == begin_assoc_array) {
    bintoken::iarchive::load<trial::protocol::bintoken::token::begin_assoc_array>(ar);
    local_40.super_type.m_initialized = false;
    load_overloader<trial::protocol::bintoken::iarchive,_boost::optional<unsigned_long>,_void>::load
              (ar,&local_40,protocol_version);
    if ((ar->reader).decoder.current.code != end_assoc_array) {
      paVar1 = &local_68.first.field_2;
      do {
        local_68.first._M_string_length = 0;
        local_68.first.field_2._M_local_buf[0] = '\0';
        local_68.second = false;
        local_68.first._M_dataplus._M_p = (pointer)paVar1;
        bintoken::iarchive::load<std::__cxx11::string>(ar,&local_68.first);
        bintoken::iarchive::load<bool>(ar,&local_68.second);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                    *)data,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_68.first._M_dataplus._M_p,
                          CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                                   local_68.first.field_2._M_local_buf[0]) + 1);
        }
      } while ((ar->reader).decoder.current.code != end_assoc_array);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::end_assoc_array>(ar);
  }
  else {
    if (vVar2 != deprecated_begin_assoc_array) {
      this = (error *)__cxa_allocate_exception(0x20);
      bintoken::error::error(this,unexpected_token);
      __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::deprecated_begin_assoc_array>(ar);
    local_40.super_type.m_initialized = false;
    load_overloader<trial::protocol::bintoken::iarchive,_boost::optional<unsigned_long>,_void>::load
              (ar,&local_40,protocol_version);
    if ((ar->reader).decoder.current.code != deprecated_end_assoc_array) {
      paVar1 = &local_68.first.field_2;
      do {
        local_68.first._M_string_length = 0;
        local_68.first.field_2._M_local_buf[0] = '\0';
        local_68.second = false;
        local_68.first._M_dataplus._M_p = (pointer)paVar1;
        load_overloader<trial::protocol::bintoken::iarchive,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_void>
        ::load(ar,&local_68,protocol_version);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                    *)data,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_68.first._M_dataplus._M_p,
                          CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                                   local_68.first.field_2._M_local_buf[0]) + 1);
        }
      } while ((ar->reader).decoder.current.code != deprecated_end_assoc_array);
    }
    bintoken::iarchive::load<trial::protocol::bintoken::token::deprecated_end_assoc_array>(ar);
  }
  return;
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        switch (ar.code())
        {
        case bintoken::token::code::deprecated_begin_assoc_array:
        {
            ar.load<bintoken::token::deprecated_begin_assoc_array>();
            boost::optional<std::size_t> count;
            ar.load_override(count, protocol_version);
            while (!ar.at<bintoken::token::deprecated_end_assoc_array>())
            {
                // We cannot use std::map<Key, T>::value_type because it has a const key
                std::pair<Key, T> value;
                ar.load_override(value, protocol_version);
                data.insert(value);
            }
            ar.load<bintoken::token::deprecated_end_assoc_array>();
            break;
        }

        case bintoken::token::code::begin_assoc_array:
        {
            ar.load<bintoken::token::begin_assoc_array>();
            boost::optional<std::size_t> count;
            ar.load_override(count, protocol_version);
            while (!ar.at<bintoken::token::end_assoc_array>())
            {
                // We cannot use std::map<Key, T>::value_type because it has a const key
                std::pair<Key, T> value;
                ar.load_override(value.first, protocol_version);
                ar.load_override(value.second, protocol_version);
                data.insert(value);
            }
            ar.load<bintoken::token::end_assoc_array>();
            break;
        }

        default:
            throw bintoken::error(bintoken::unexpected_token);
        }
    }